

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerator::InfoT::LogError(InfoT *this,GenT genType,string_view message)

{
  cmQtAutoGenerator *pcVar1;
  string_view text;
  string_view message_00;
  string local_70;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  text._M_str = message._M_str;
  local_30._M_len = message._M_len;
  pcVar1 = this->Gen_;
  text._M_len = (size_t)(pcVar1->InfoFile_)._M_dataplus._M_p;
  local_30._M_str = text._M_str;
  cmQtAutoGen::Quoted_abi_cxx11_(&local_50,(cmQtAutoGen *)(pcVar1->InfoFile_)._M_string_length,text)
  ;
  cmStrCat<char_const(&)[25],std::__cxx11::string,char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&>
            (&local_70,(char (*) [25])"Info error in info file\n",&local_50,(char (*) [3])0x6a0838,
             &local_30);
  message_00._M_str = local_70._M_dataplus._M_p;
  message_00._M_len = local_70._M_string_length;
  Logger::Error(&pcVar1->Logger_,genType,message_00);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool cmQtAutoGenerator::InfoT::LogError(GenT genType,
                                        cm::string_view message) const
{
  this->Gen_.Log().Error(genType,
                         cmStrCat("Info error in info file\n",
                                  Quoted(this->Gen_.InfoFile()), ":\n",
                                  message));
  return false;
}